

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

void Sdm_ManFree(Sdm_Man_t *p)

{
  Sdm_Man_t *p_local;
  
  Vec_WrdFree(p->vPerm6);
  Vec_IntFree(p->vMap2Perm);
  Vec_IntFree(p->vConfgRes);
  Vec_IntFree(p->pHash->vData);
  Hsh_IntManStop(p->pHash);
  if (p != (Sdm_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sdm_ManFree( Sdm_Man_t * p )
{
    Vec_WrdFree( p->vPerm6 );
    Vec_IntFree( p->vMap2Perm );
    Vec_IntFree( p->vConfgRes );
    Vec_IntFree( p->pHash->vData );
    Hsh_IntManStop( p->pHash );
    ABC_FREE( p );
}